

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall pfederc::BaseLogger::info(BaseLogger *this,string *msg)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(this->out,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void BaseLogger::info(const std::string &msg) noexcept {
  out << msg << std::endl;
}